

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Admin.h
# Opt level: O2

void __thiscall Admin::resizeRooms(Admin *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  Room *pRVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Room *pRVar9;
  int i;
  long lVar10;
  long lVar11;
  University *pUVar12;
  ulong uVar13;
  ulong uVar14;
  
  pUVar12 = Innopolis;
  iVar3 = Innopolis->rooms_count;
  uVar14 = (ulong)(iVar3 * 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar14;
  uVar13 = 0xffffffffffffffff;
  if (SUB168(auVar5 * ZEXT816(0x28),8) == 0) {
    uVar13 = SUB168(auVar5 * ZEXT816(0x28),0);
  }
  pRVar9 = (Room *)operator_new__(uVar13);
  if (iVar3 != 0) {
    lVar11 = 0;
    do {
      Room::Room((Room *)((long)&pRVar9->name + lVar11));
      lVar11 = lVar11 + 0x28;
      pUVar12 = Innopolis;
    } while (uVar14 * 0x28 - lVar11 != 0);
  }
  lVar11 = 0;
  for (lVar10 = 0; lVar10 < pUVar12->rooms_count; lVar10 = lVar10 + 1) {
    pRVar4 = pUVar12->rooms;
    *(undefined4 *)((long)&pRVar9->room_id + lVar11) =
         *(undefined4 *)((long)&pRVar4->room_id + lVar11);
    puVar1 = (undefined8 *)((long)&pRVar4->name + lVar11);
    uVar6 = *puVar1;
    uVar7 = puVar1[1];
    puVar1 = (undefined8 *)((long)&pRVar4->specialAccessedUsers_count + lVar11);
    uVar8 = puVar1[1];
    puVar2 = (undefined8 *)((long)&pRVar9->specialAccessedUsers_count + lVar11);
    *puVar2 = *puVar1;
    puVar2[1] = uVar8;
    puVar1 = (undefined8 *)((long)&pRVar9->name + lVar11);
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
    lVar11 = lVar11 + 0x28;
  }
  pUVar12->rooms_count = pUVar12->rooms_count * 2;
  pUVar12->rooms = pRVar9;
  return;
}

Assistant:

void resizeRooms(){
        Room* resizesRoomList = new Room[Innopolis->rooms_count*2];
        for(int i=0;i<Innopolis->rooms_count;i++){
            resizesRoomList[i] = Innopolis->rooms[i];
        }
        Innopolis->rooms_count<<=1;
        Innopolis->rooms = resizesRoomList;
    }